

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.h
# Opt level: O0

Unique<Entry<Line<3L>_>_> __thiscall
anurbs::Entry<anurbs::Line<3L>_>::create
          (Entry<anurbs::Line<3L>_> *this,shared_ptr<anurbs::Line<3L>_> *data)

{
  unique_ptr<anurbs::Attributes,_std::default_delete<anurbs::Attributes>_> local_30;
  undefined1 local_28 [8];
  Pointer<Attributes> attributes;
  shared_ptr<anurbs::Line<3L>_> *data_local;
  
  attributes.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)data;
  new_<anurbs::Attributes>();
  std::shared_ptr<anurbs::Attributes>::
  shared_ptr<anurbs::Attributes,std::default_delete<anurbs::Attributes>,void>
            ((shared_ptr<anurbs::Attributes> *)local_28,&local_30);
  std::unique_ptr<anurbs::Attributes,_std::default_delete<anurbs::Attributes>_>::~unique_ptr
            (&local_30);
  new_<anurbs::Entry<anurbs::Line<3l>>,std::shared_ptr<anurbs::Line<3l>>&,std::shared_ptr<anurbs::Attributes>&>
            ((anurbs *)this,data,(shared_ptr<anurbs::Attributes> *)local_28);
  std::shared_ptr<anurbs::Attributes>::~shared_ptr((shared_ptr<anurbs::Attributes> *)local_28);
  return (__uniq_ptr_data<anurbs::Entry<anurbs::Line<3L>_>,_std::default_delete<anurbs::Entry<anurbs::Line<3L>_>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Entry<anurbs::Line<3L>_>,_std::default_delete<anurbs::Entry<anurbs::Line<3L>_>_>,_true,_true>
            )this;
}

Assistant:

static Unique<Entry<TData>> create(std::shared_ptr<TData> data)
    {
        Pointer<Attributes> attributes = new_<Attributes>();
        return new_<Entry<TData>>(data, attributes);
    }